

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::Parser(Parser *this)

{
  element_type *peVar1;
  __shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  __shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = in_RDI;
  std::shared_ptr<arangodb::velocypack::Builder>::shared_ptr
            ((shared_ptr<arangodb::velocypack::Builder> *)0x103ccf);
  this_00[1]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *)&this_00[2]._M_ptr)->
  _M_ptr = (element_type *)0x0;
  this_00[2]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &((__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *)&this_00[3]._M_ptr)
    ->_M_ptr = 0;
  this_00[3]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&Options::Defaults;
  std::make_shared<arangodb::velocypack::Builder>();
  std::shared_ptr<arangodb::velocypack::Builder>::operator=
            ((shared_ptr<arangodb::velocypack::Builder> *)this_00,
             (shared_ptr<arangodb::velocypack::Builder> *)in_RDI);
  std::shared_ptr<arangodb::velocypack::Builder>::~shared_ptr
            ((shared_ptr<arangodb::velocypack::Builder> *)0x103d22);
  peVar1 = std::__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI)
  ;
  in_RDI[1]._M_ptr = peVar1;
  (in_RDI[1]._M_ptr)->options = &Options::Defaults;
  return;
}

Assistant:

Parser()
      : _start(nullptr),
        _size(0),
        _pos(0),
        _nesting(0),
        options(&Options::Defaults) {
    _builder = std::make_shared<Builder>();
    _builderPtr = _builder.get();
    _builderPtr->options = &Options::Defaults;
  }